

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::PushExpr
          (WatWriter *this,Expr *expr,Index operand_count,Index result_count)

{
  bool bVar1;
  pointer pEVar2;
  const_iterator local_b0;
  const_iterator local_a8;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *local_a0;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *local_98;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  local_90;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  local_88;
  __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
  local_80;
  iterator last_operand;
  ExprTree tree;
  undefined1 local_40 [16];
  reverse_iterator iter;
  iterator iStack_28;
  Index current_count;
  iterator first_operand;
  Index result_count_local;
  Index operand_count_local;
  Expr *expr_local;
  WatWriter *this_local;
  
  first_operand._M_current._0_4_ = result_count;
  first_operand._M_current._4_4_ = operand_count;
  iStack_28 = std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::end(&this->expr_tree_stack_);
  iter.current._M_current._4_4_ = 0;
  if (first_operand._M_current._4_4_ != 0) {
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::rbegin((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              *)(local_40 + 8));
    while( true ) {
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::rend((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              *)local_40);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                               *)(local_40 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                               *)local_40);
      if (!bVar1) break;
      pEVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                             *)(local_40 + 8));
      if (pEVar2->result_count == 0) {
        __assert_fail("iter->result_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wat-writer.cc"
                      ,0x3dd,
                      "void wabt::(anonymous namespace)::WatWriter::PushExpr(const Expr *, Index, Index)"
                     );
      }
      pEVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                             *)(local_40 + 8));
      iter.current._M_current._4_4_ = pEVar2->result_count + iter.current._M_current._4_4_;
      if (iter.current._M_current._4_4_ == first_operand._M_current._4_4_) {
        tree._32_8_ = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                      ::base((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                              *)(local_40 + 8));
        iStack_28._M_current =
             (ExprTree *)
             __gnu_cxx::
             __normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
             ::operator-((__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                          *)&tree.result_count,1);
        break;
      }
      if (first_operand._M_current._4_4_ < iter.current._M_current._4_4_) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>_>
                    *)(local_40 + 8));
    }
  }
  ExprTree::ExprTree((ExprTree *)&last_operand,expr,(Index)first_operand._M_current);
  if ((iter.current._M_current._4_4_ == first_operand._M_current._4_4_) &&
     (first_operand._M_current._4_4_ != 0)) {
    local_90._M_current =
         (ExprTree *)
         std::
         vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ::end(&this->expr_tree_stack_);
    local_88._M_current = iStack_28._M_current;
    local_80._M_current = local_90._M_current;
    local_98 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                *)std::
                  back_inserter<std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                            ((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                              *)&tree);
    local_a0 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                *)std::
                  move<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,std::back_insert_iterator<std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>>
                            (local_88,local_90,
                             (back_insert_iterator<std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                              )local_98);
    __gnu_cxx::
    __normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
    ::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*>
              ((__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                *)&local_a8,&stack0xffffffffffffffd8);
    __gnu_cxx::
    __normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
    ::__normal_iterator<wabt::(anonymous_namespace)::ExprTree*>
              ((__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>
                *)&local_b0,&local_80);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::erase(&this->expr_tree_stack_,local_a8,local_b0);
  }
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::emplace_back<wabt::(anonymous_namespace)::ExprTree>
            (&this->expr_tree_stack_,(ExprTree *)&last_operand);
  if ((first_operand._M_current._4_4_ < iter.current._M_current._4_4_) ||
     ((Index)first_operand._M_current == 0)) {
    FlushExprTreeStack(this);
  }
  ExprTree::~ExprTree((ExprTree *)&last_operand);
  return;
}

Assistant:

void WatWriter::PushExpr(const Expr* expr,
                         Index operand_count,
                         Index result_count) {
  WABT_TRACE_ARGS(PushExpr, "%s, %" PRIindex ", %" PRIindex "",
                  GetExprTypeName(*expr), operand_count, result_count);

  // Try to pop operand off the expr stack to use as this expr's children. One
  // expr can have multiple return values (with the multi-value extension), so
  // we have to iterate over each in reverse.

  auto first_operand = expr_tree_stack_.end();

  Index current_count = 0;
  if (operand_count > 0) {
    for (auto iter = expr_tree_stack_.rbegin(); iter != expr_tree_stack_.rend();
         ++iter) {
      assert(iter->result_count > 0);
      current_count += iter->result_count;

      if (current_count == operand_count) {
        first_operand = iter.base() - 1;
        break;
      } else if (current_count > operand_count) {
        // We went over the number of operands this instruction wants; this can
        // only happen when there are expressions on the stack with a
        // result_count > 1. When this happens we can't fold, since any result
        // we produce will not make sense.
        break;
      }
    }
  }

  ExprTree tree(expr, result_count);

  if (current_count == operand_count && operand_count > 0) {
    auto last_operand = expr_tree_stack_.end();
    std::move(first_operand, last_operand, std::back_inserter(tree.children));
    expr_tree_stack_.erase(first_operand, last_operand);
  }

  expr_tree_stack_.emplace_back(std::move(tree));
  if (current_count > operand_count || result_count == 0) {
    FlushExprTreeStack();
  }
}